

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

Real __thiscall soplex::Random::next_random(Random *this)

{
  uint64_t t;
  Random *this_local;
  
  this->lin_seed = this->lin_seed * 0x41c64e6d + 0x3039;
  this->xor_seed = this->xor_seed ^ this->xor_seed << 0xd;
  this->xor_seed = this->xor_seed ^ this->xor_seed >> 0x11;
  this->xor_seed = this->xor_seed ^ this->xor_seed << 5;
  *(ulong *)&this->mwc_seed = (ulong)this->mwc_seed * 0x29a65ead + (ulong)this->cst_seed;
  return (double)(this->lin_seed + this->xor_seed + this->mwc_seed) / 4294967295.0;
}

Assistant:

Real next_random()
   {
      uint64_t t;

      /* linear congruential */
      lin_seed = (uint32_t)(lin_seed * SOPLEX_RSTEP + SOPLEX_RADD);

      /* Xorshift */
      xor_seed ^= (xor_seed << 13);
      xor_seed ^= (xor_seed >> 17);
      xor_seed ^= (xor_seed << 5);

      /* Multiply-with-carry */
      t = UINT64_C(698769069) * mwc_seed + cst_seed;
      cst_seed = (uint32_t)(t >> 32);
      mwc_seed = (uint32_t) t;

      return (lin_seed + xor_seed + mwc_seed) / (Real)UINT32_MAX;
   }